

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStrategy.cpp
# Opt level: O1

void __thiscall SimpleStrategy::process(SimpleStrategy *this)

{
  ofstream *poVar1;
  CFG *pCVar2;
  Addr addr;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  char cVar8;
  bool bVar9;
  const_iterator __position;
  ostream *poVar10;
  long *plVar11;
  _Base_ptr p_Var12;
  _Rb_tree_node_base *p_Var13;
  long lVar14;
  char *pcVar15;
  Report r;
  Report total;
  set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> bCFGs;
  Report local_190;
  Report local_110;
  _Rb_tree<CFG_*,_CFG_*,_std::_Identity<CFG_*>,_std::less<CFG_*>,_std::allocator<CFG_*>_> local_90;
  _Rb_tree<CFG_*,_CFG_*,_std::_Identity<CFG_*>,_std::less<CFG_*>,_std::allocator<CFG_*>_> local_60;
  
  local_110._vptr_Report = (_func_int **)&PTR__Report_00117c58;
  local_110.matched._vptr_Stats = (_func_int **)&PTR__Stats_00117c88;
  local_110.matched.cfgs = 0;
  local_110.matched.instrs = 0;
  local_110.matched.blocks = 0;
  local_110.matched.phantoms = 0;
  local_110.matched.edges = 0;
  local_110.matched.calls = 0;
  local_110.matched.indirects = 0;
  local_110.unmatched.a._vptr_Stats = (_func_int **)&PTR__Stats_00117c88;
  local_110.unmatched.a.cfgs = 0;
  local_110.unmatched.a.instrs = 0;
  local_110.unmatched.a.blocks = 0;
  local_110.unmatched.a.phantoms = 0;
  local_110.unmatched.a.edges = 0;
  local_110.unmatched.a.calls = 0;
  local_110.unmatched.a.indirects = 0;
  local_110.unmatched.b._vptr_Stats = (_func_int **)&PTR__Stats_00117c88;
  local_110.unmatched.b.cfgs = 0;
  local_110.unmatched.b.instrs = 0;
  local_110.unmatched.b.blocks = 0;
  local_110.unmatched.b.phantoms = 0;
  local_110.unmatched.b.edges = 0;
  local_110.unmatched.b.calls = 0;
  local_110.unmatched.b.indirects = 0;
  poVar1 = &(this->super_Strategy).m_fout;
  cVar8 = std::__basic_file<char>::is_open();
  if (cVar8 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"file,cfg,instrs,blocks,phantoms,edges,calls",0x2b);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  CFGsContainer::cfgs((set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> *)&local_90,
                      (this->super_Strategy).m_b);
  CFGsContainer::cfgs((set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> *)&local_60,
                      (this->super_Strategy).m_a);
  for (p_Var12 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var12 != &local_60._M_impl.super__Rb_tree_header;
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12)) {
    pCVar2 = *(CFG **)(p_Var12 + 1);
    if (pCVar2->m_status == VALID) {
      addr = pCVar2->m_addr;
      bVar9 = Strategy::isAddrInRange(&this->super_Strategy,addr);
      __position._M_node = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
      if (bVar9) {
        while (((_Rb_tree_header *)__position._M_node != &local_90._M_impl.super__Rb_tree_header &&
               (*(Addr *)(*(long *)(__position._M_node + 1) + 8) != addr))) {
          __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
        }
        if (((_Rb_tree_header *)__position._M_node == &local_90._M_impl.super__Rb_tree_header) ||
           (*(int *)(*(long *)(__position._M_node + 1) + 0x10) != 2)) {
          if ((this->super_Strategy).m_config.both == false) {
            extractStats((Stats *)&local_190,this,pCVar2);
            iVar7 = local_190.matched.phantoms;
            iVar6 = local_190.matched.blocks;
            iVar5 = local_190.matched.instrs;
            iVar4 = local_190.matched.cfgs;
            iVar3 = local_190.matched._vptr_Stats._4_4_;
            local_110.unmatched.a.instrs =
                 local_110.unmatched.a.instrs + local_190.matched._vptr_Stats._4_4_;
            local_110.unmatched.a.cfgs =
                 local_110.unmatched.a.cfgs + (int)local_190.matched._vptr_Stats;
            local_110.unmatched.a.blocks = local_110.unmatched.a.blocks + local_190.matched.cfgs;
            local_110.unmatched.a.phantoms =
                 local_110.unmatched.a.phantoms + local_190.matched.instrs;
            local_110.unmatched.a.edges = local_110.unmatched.a.edges + local_190.matched.blocks;
            local_110.unmatched.a.indirects =
                 local_110.unmatched.a.indirects + local_190.matched.edges;
            local_110.unmatched.a.calls = local_110.unmatched.a.calls + local_190.matched.phantoms;
            if ((this->super_Strategy).m_config.detailed == true) {
              *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
                   *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5
                   | 8;
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"CFG 0x",6);
              poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,": file A",8);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
              std::ostream::put((char)poVar10);
              std::ostream::flush();
              *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
                   *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5
                   | 2;
              operator<<((ostream *)&std::cout,(Stats *)&local_190);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
              std::ostream::put(-0x18);
              std::ostream::flush();
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
              std::ostream::put(-0x18);
              std::ostream::flush();
            }
            cVar8 = std::__basic_file<char>::is_open();
            if (cVar8 != '\0') {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"A,0x",4);
              lVar14 = *(long *)(*(long *)&(this->super_Strategy).m_fout + -0x18);
              *(uint *)(&(this->super_Strategy).field_0x80 + lVar14) =
                   *(uint *)(&(this->super_Strategy).field_0x80 + lVar14) & 0xffffffb5 | 8;
              poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
              *(uint *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x18) =
                   *(uint *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x18) & 0xffffffb5 | 2;
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
              poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,iVar3);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
              poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,iVar4);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
              poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,iVar5);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
              poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,iVar6);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
              plVar11 = (long *)std::ostream::operator<<((ostream *)poVar10,iVar7);
              std::ios::widen((char)*(undefined8 *)(*plVar11 + -0x18) + (char)plVar11);
              std::ostream::put((char)plVar11);
              std::ostream::flush();
            }
          }
        }
        else {
          compareCFGs(&local_190,this,pCVar2,*(CFG **)(__position._M_node + 1));
          local_110.matched.instrs = local_110.matched.instrs + local_190.matched.instrs;
          local_110.matched.cfgs = local_110.matched.cfgs + local_190.matched.cfgs;
          local_110.matched.blocks = local_110.matched.blocks + local_190.matched.blocks;
          local_110.matched.phantoms = local_110.matched.phantoms + local_190.matched.phantoms;
          local_110.matched.edges = local_110.matched.edges + local_190.matched.edges;
          local_110.matched.indirects = local_110.matched.indirects + local_190.matched.indirects;
          local_110.matched.calls = local_110.matched.calls + local_190.matched.calls;
          local_110.unmatched.a.instrs = local_110.unmatched.a.instrs + local_190.unmatched.a.instrs
          ;
          local_110.unmatched.a.cfgs = local_110.unmatched.a.cfgs + local_190.unmatched.a.cfgs;
          local_110.unmatched.a.blocks = local_110.unmatched.a.blocks + local_190.unmatched.a.blocks
          ;
          local_110.unmatched.a.phantoms =
               local_110.unmatched.a.phantoms + local_190.unmatched.a.phantoms;
          local_110.unmatched.a.edges = local_110.unmatched.a.edges + local_190.unmatched.a.edges;
          local_110.unmatched.a.indirects =
               local_110.unmatched.a.indirects + local_190.unmatched.a.indirects;
          local_110.unmatched.a.calls = local_110.unmatched.a.calls + local_190.unmatched.a.calls;
          local_110.unmatched.b.instrs = local_110.unmatched.b.instrs + local_190.unmatched.b.instrs
          ;
          local_110.unmatched.b.cfgs = local_110.unmatched.b.cfgs + local_190.unmatched.b.cfgs;
          local_110.unmatched.b.blocks = local_110.unmatched.b.blocks + local_190.unmatched.b.blocks
          ;
          local_110.unmatched.b.phantoms =
               local_110.unmatched.b.phantoms + local_190.unmatched.b.phantoms;
          local_110.unmatched.b.edges = local_110.unmatched.b.edges + local_190.unmatched.b.edges;
          local_110.unmatched.b.indirects =
               local_110.unmatched.b.indirects + local_190.unmatched.b.indirects;
          local_110.unmatched.b.calls = local_110.unmatched.b.calls + local_190.unmatched.b.calls;
          if ((this->super_Strategy).m_config.detailed == true) {
            *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
                 *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 |
                 8;
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"CFG 0x",6);
            poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            bVar9 = (this->super_Strategy).m_config.both != false;
            pcVar15 = ": both files";
            if (bVar9) {
              pcVar15 = "";
            }
            lVar14 = 0xc;
            if (bVar9) {
              lVar14 = 0;
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar15,lVar14);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
            std::ostream::put((char)poVar10);
            std::ostream::flush();
            *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
                 *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 |
                 2;
            operator<<((ostream *)&std::cout,&local_190);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
            std::ostream::put(-0x18);
            std::ostream::flush();
          }
          cVar8 = std::__basic_file<char>::is_open();
          if (cVar8 != '\0') {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"both,0x",7);
            lVar14 = *(long *)(*(long *)&(this->super_Strategy).m_fout + -0x18);
            *(uint *)(&(this->super_Strategy).field_0x80 + lVar14) =
                 *(uint *)(&(this->super_Strategy).field_0x80 + lVar14) & 0xffffffb5 | 8;
            poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            *(uint *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x18) =
                 *(uint *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x18) & 0xffffffb5 | 2;
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
            poVar10 = (ostream *)
                      std::ostream::operator<<((ostream *)poVar10,local_190.matched.instrs);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
            poVar10 = (ostream *)
                      std::ostream::operator<<((ostream *)poVar10,local_190.matched.blocks);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
            poVar10 = (ostream *)
                      std::ostream::operator<<((ostream *)poVar10,local_190.matched.phantoms);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
            poVar10 = (ostream *)
                      std::ostream::operator<<((ostream *)poVar10,local_190.matched.edges);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
            plVar11 = (long *)std::ostream::operator<<((ostream *)poVar10,local_190.matched.calls);
            std::ios::widen((char)*(undefined8 *)(*plVar11 + -0x18) + (char)plVar11);
            std::ostream::put((char)plVar11);
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"A,0x",4);
            lVar14 = *(long *)(*(long *)&(this->super_Strategy).m_fout + -0x18);
            *(uint *)(&(this->super_Strategy).field_0x80 + lVar14) =
                 *(uint *)(&(this->super_Strategy).field_0x80 + lVar14) & 0xffffffb5 | 8;
            poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            *(uint *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x18) =
                 *(uint *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x18) & 0xffffffb5 | 2;
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
            poVar10 = (ostream *)
                      std::ostream::operator<<((ostream *)poVar10,local_190.unmatched.a.instrs);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
            poVar10 = (ostream *)
                      std::ostream::operator<<((ostream *)poVar10,local_190.unmatched.a.blocks);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
            poVar10 = (ostream *)
                      std::ostream::operator<<((ostream *)poVar10,local_190.unmatched.a.phantoms);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
            poVar10 = (ostream *)
                      std::ostream::operator<<((ostream *)poVar10,local_190.unmatched.a.edges);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
            plVar11 = (long *)std::ostream::operator<<
                                        ((ostream *)poVar10,local_190.unmatched.a.calls);
            std::ios::widen((char)*(undefined8 *)(*plVar11 + -0x18) + (char)plVar11);
            std::ostream::put((char)plVar11);
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"B,0x",4);
            lVar14 = *(long *)(*(long *)&(this->super_Strategy).m_fout + -0x18);
            *(uint *)(&(this->super_Strategy).field_0x80 + lVar14) =
                 *(uint *)(&(this->super_Strategy).field_0x80 + lVar14) & 0xffffffb5 | 8;
            poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            *(uint *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x18) =
                 *(uint *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x18) & 0xffffffb5 | 2;
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
            poVar10 = (ostream *)
                      std::ostream::operator<<((ostream *)poVar10,local_190.unmatched.b.instrs);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
            poVar10 = (ostream *)
                      std::ostream::operator<<((ostream *)poVar10,local_190.unmatched.b.blocks);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
            poVar10 = (ostream *)
                      std::ostream::operator<<((ostream *)poVar10,local_190.unmatched.b.phantoms);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
            poVar10 = (ostream *)
                      std::ostream::operator<<((ostream *)poVar10,local_190.unmatched.b.edges);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
            plVar11 = (long *)std::ostream::operator<<
                                        ((ostream *)poVar10,local_190.unmatched.b.calls);
            std::ios::widen((char)*(undefined8 *)(*plVar11 + -0x18) + (char)plVar11);
            std::ostream::put((char)plVar11);
            std::ostream::flush();
          }
          std::_Rb_tree<CFG*,CFG*,std::_Identity<CFG*>,std::less<CFG*>,std::allocator<CFG*>>::
          erase_abi_cxx11_((_Rb_tree<CFG*,CFG*,std::_Identity<CFG*>,std::less<CFG*>,std::allocator<CFG*>>
                            *)&local_90,__position);
        }
      }
    }
  }
  std::_Rb_tree<CFG_*,_CFG_*,_std::_Identity<CFG_*>,_std::less<CFG_*>,_std::allocator<CFG_*>_>::
  ~_Rb_tree(&local_60);
  p_Var13 = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((this->super_Strategy).m_config.both == false) {
    for (; (_Rb_tree_header *)p_Var13 != &local_90._M_impl.super__Rb_tree_header;
        p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
      pCVar2 = *(CFG **)(p_Var13 + 1);
      if ((pCVar2->m_status == VALID) &&
         (bVar9 = Strategy::isAddrInRange(&this->super_Strategy,pCVar2->m_addr), bVar9)) {
        extractStats((Stats *)&local_190,this,pCVar2);
        iVar7 = local_190.matched.phantoms;
        iVar6 = local_190.matched.blocks;
        iVar5 = local_190.matched.instrs;
        iVar4 = local_190.matched.cfgs;
        iVar3 = local_190.matched._vptr_Stats._4_4_;
        local_110.unmatched.b.instrs =
             local_110.unmatched.b.instrs + local_190.matched._vptr_Stats._4_4_;
        local_110.unmatched.b.cfgs = local_110.unmatched.b.cfgs + (int)local_190.matched._vptr_Stats
        ;
        local_110.unmatched.b.blocks = local_110.unmatched.b.blocks + local_190.matched.cfgs;
        local_110.unmatched.b.phantoms = local_110.unmatched.b.phantoms + local_190.matched.instrs;
        local_110.unmatched.b.edges = local_110.unmatched.b.edges + local_190.matched.blocks;
        local_110.unmatched.b.indirects = local_110.unmatched.b.indirects + local_190.matched.edges;
        local_110.unmatched.b.calls = local_110.unmatched.b.calls + local_190.matched.phantoms;
        if ((this->super_Strategy).m_config.detailed == true) {
          *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
               *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8
          ;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"CFG 0x",6);
          poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,": file B",8);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
          std::ostream::put((char)poVar10);
          std::ostream::flush();
          *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
               *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2
          ;
          operator<<((ostream *)&std::cout,(Stats *)&local_190);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
          std::ostream::put(-0x18);
          std::ostream::flush();
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
          std::ostream::put(-0x18);
          std::ostream::flush();
        }
        cVar8 = std::__basic_file<char>::is_open();
        if (cVar8 != '\0') {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"B,0x",4);
          lVar14 = *(long *)(*(long *)&(this->super_Strategy).m_fout + -0x18);
          *(uint *)(&(this->super_Strategy).field_0x80 + lVar14) =
               *(uint *)(&(this->super_Strategy).field_0x80 + lVar14) & 0xffffffb5 | 8;
          poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
          *(uint *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x18) =
               *(uint *)(poVar10 + *(long *)(*(long *)poVar10 + -0x18) + 0x18) & 0xffffffb5 | 2;
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
          poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,iVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
          poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,iVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
          poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,iVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
          poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,iVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,",",1);
          plVar11 = (long *)std::ostream::operator<<((ostream *)poVar10,iVar7);
          std::ios::widen((char)*(undefined8 *)(*plVar11 + -0x18) + (char)plVar11);
          std::ostream::put((char)plVar11);
          std::ostream::flush();
        }
      }
    }
  }
  if ((this->super_Strategy).m_config.detailed == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Total:",6);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
  }
  operator<<((ostream *)&std::cout,&local_110);
  std::_Rb_tree<CFG_*,_CFG_*,_std::_Identity<CFG_*>,_std::less<CFG_*>,_std::allocator<CFG_*>_>::
  ~_Rb_tree(&local_90);
  return;
}

Assistant:

void SimpleStrategy::process() {
	SimpleStrategy::Report total;

	if (m_fout.is_open())
		m_fout << "file,cfg,instrs,blocks,phantoms,edges,calls" << std::endl;

	std::set<CFG*> bCFGs = m_b->cfgs();
	for (CFG* cfg : m_a->cfgs()) {
		if (cfg->status() != CFG::VALID)
			continue;

		Addr addr = cfg->addr();
		if (!this->isAddrInRange(addr))
			continue;

		std::set<CFG*>::iterator it = std::find_if(bCFGs.begin(), bCFGs.end(),
		             [addr](const CFG* tmp) -> bool { return tmp->addr() == addr; });
		if (it != bCFGs.end() && (*it)->status() == CFG::VALID) {
			SimpleStrategy::Report r = compareCFGs(cfg, *it);
			total.matched += r.matched;
			total.unmatched.a += r.unmatched.a;
			total.unmatched.b += r.unmatched.b;

			if (m_config.detailed) {
				std::cout << std::hex;
				std::cout << "CFG 0x" << addr << (!m_config.both ? ": both files" : "") << std::endl;

				std::cout << std::dec;
				std::cout << r;
				std::cout << std::endl;
			}

			if (m_fout.is_open()) {
				m_fout << "both,0x" << std::hex << addr << std::dec
						<< "," << r.matched.instrs << "," << r.matched.blocks
						<< "," << r.matched.phantoms << "," << r.matched.edges
						<< "," << r.matched.calls << std::endl;
				m_fout << "A,0x" << std::hex << addr << std::dec
						<< "," << r.unmatched.a.instrs << "," << r.unmatched.a.blocks
						<< "," << r.unmatched.a.phantoms << "," << r.unmatched.a.edges
						<< "," << r.unmatched.a.calls << std::endl;
				m_fout << "B,0x" << std::hex << addr << std::dec
						<< "," << r.unmatched.b.instrs << "," << r.unmatched.b.blocks
						<< "," << r.unmatched.b.phantoms << "," << r.unmatched.b.edges
						<< "," << r.unmatched.b.calls << std::endl;
			}

			bCFGs.erase(it);
		} else {
			if (!m_config.both) {
				SimpleStrategy::Stats s = extractStats(cfg);
				total.unmatched.a += s;

				if (m_config.detailed) {
					std::cout << std::hex;
					std::cout << "CFG 0x" << addr << ": file A" << std::endl;

					std::cout << std::dec;
					std::cout << s << std::endl;
					std::cout << std::endl;
				}

				if (m_fout.is_open()) {
					m_fout << "A,0x" << std::hex << addr << std::dec
							<< "," << s.instrs << "," << s.blocks
							<< "," << s.phantoms << "," << s.edges
							<< "," << s.calls << std::endl;
				}
			}
		}
	}

	if (!m_config.both) {
		for (CFG* cfg : bCFGs) {
			if (cfg->status() != CFG::VALID)
				continue;

			Addr addr = cfg->addr();
			if (!this->isAddrInRange(addr))
				continue;

			SimpleStrategy::Stats s = extractStats(cfg);
			total.unmatched.b += s;

			if (m_config.detailed) {
				std::cout << std::hex;
				std::cout << "CFG 0x" << cfg->addr() << ": file B" << std::endl;

				std::cout << std::dec;
				std::cout << s << std::endl;
				std::cout << std::endl;
			}

			if (m_fout.is_open()) {
				m_fout << "B,0x" << std::hex << cfg->addr() << std::dec
						<< "," << s.instrs << "," << s.blocks
						<< "," << s.phantoms << "," << s.edges
						<< "," << s.calls << std::endl;
			}
		}
	}

	if (m_config.detailed)
		std::cout << "Total:" << std::endl;
	std::cout << total;
}